

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O3

cf_bool_t cf_str_center(cf_char_t *dst,cf_size_t size,cf_char_t *s,cf_char_t c,cf_size_t total)

{
  char cVar1;
  size_t sVar2;
  cf_char_t *__s;
  cf_bool_t cVar3;
  char *pcVar4;
  
  cVar3 = 0;
  if (s != (cf_char_t *)0x0 && dst != (cf_char_t *)0x0) {
    sVar2 = strlen(s);
    cVar3 = 0;
    if (total + 1 <= size && sVar2 + 1 <= size) {
      __s = dst;
      if (1 < total - sVar2) {
        __s = dst + (total - sVar2 >> 1);
        if (dst + (total - sVar2 >> 1) <= dst + 1) {
          __s = dst + 1;
        }
        memset(dst,(uint)(byte)c,(long)__s - (long)dst);
      }
      cVar1 = *s;
      if (cVar1 != '\0') {
        pcVar4 = s + 1;
        do {
          *__s = cVar1;
          __s = __s + 1;
          cVar1 = *pcVar4;
          pcVar4 = pcVar4 + 1;
        } while (cVar1 != '\0');
      }
      pcVar4 = dst + total;
      if (__s < pcVar4) {
        memset(__s,(uint)(byte)c,(long)pcVar4 - (long)__s);
      }
      *pcVar4 = '\0';
      cVar3 = 1;
    }
  }
  return cVar3;
}

Assistant:

cf_bool_t cf_str_center(cf_char_t* dst, cf_size_t size, cf_char_t* s, cf_char_t c, cf_size_t total) {
    cf_size_t left = 0, len = 0;
    cf_char_t* p = CF_NULL_PTR;
    if (!dst || !s) {
        return CF_FALSE;
    }
    // no enough space to hold 
    len = strlen(s);
    if (len + 1 > size || total + 1 > size) {
        return CF_FALSE;
    }

    left = (total - len) / 2;
    p = dst;
    // fill left
    while (p < dst + left) {
        *p = c;
        p++;
    }
    // copy string
    while (*s != '\0') {
        *p = *s;
        s++;
        p++;
    }
    // fill right
    while (p < dst + total) {
        *p = c;
        p++;
    }
    dst[total] = '\0';
    
    return CF_TRUE;
}